

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_startSample(qpTestLog *log)

{
  deBool dVar1;
  qpTestLog *log_local;
  
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_startElement(log->writer,"Sample",0,(qpXmlAttribute *)0x0);
  if (dVar1 != 0) {
    deMutex_unlock(log->lock);
  }
  else {
    qpPrintf("qpTestLog_startSample(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)(dVar1 != 0);
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_startSample (qpTestLog* log)
{
	DE_ASSERT(log);
	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLELIST);

	if (!qpXmlWriter_startElement(log->writer, "Sample", 0, DE_NULL))
	{
		qpPrintf("qpTestLog_startSample(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_SAMPLE));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}